

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeFormatter.cpp
# Opt level: O3

void __thiscall
cali::TreeFormatter::TreeFormatterImpl::configure(TreeFormatterImpl *this,QuerySpec *spec)

{
  pointer pbVar1;
  pointer pbVar2;
  int iVar3;
  const_iterator cVar4;
  ostream *poVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __position;
  long lVar6;
  _Rb_tree_header *p_Var7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  bool ok;
  ulong local_268;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  undefined1 local_238 [8];
  char *local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [14];
  ios_base local_140 [264];
  int local_38;
  
  local_238 = (undefined1  [8])local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"path-attributes","");
  this_00 = &(spec->format).kwargs;
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,(key_type *)local_238);
  if (local_238 != (undefined1  [8])local_228) {
    operator_delete((void *)local_238,local_228[0]._M_allocated_capacity + 1);
  }
  p_Var7 = &(spec->format).kwargs._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar4._M_node != p_Var7) {
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_258,*(long *)(cVar4._M_node + 2),
               (long)&(cVar4._M_node[2]._M_parent)->_M_color + *(long *)(cVar4._M_node + 2));
    util::
    split<std::__cxx11::string,char,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (&local_258,',',
               (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )&this->m_path_key_names);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
  }
  local_238 = (undefined1  [8])local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"column-width","");
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,(key_type *)local_238);
  if (local_238 != (undefined1  [8])local_228) {
    operator_delete((void *)local_238,local_228[0]._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar4._M_node != p_Var7) {
    local_268 = local_268 & 0xffffffffffffff00;
    local_260 = this_00;
    local_238 = (undefined1  [8])local_228;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_238,*(long *)(cVar4._M_node + 2),
               (long)&(cVar4._M_node[2]._M_parent)->_M_color + *(long *)(cVar4._M_node + 2));
    iVar3 = StringConverter::to_int((StringConverter *)local_238,(bool *)&local_268);
    this->m_max_column_width = iVar3;
    if (local_238 != (undefined1  [8])local_228) {
      operator_delete((void *)local_238,local_228[0]._M_allocated_capacity + 1);
    }
    this_00 = local_260;
    if (local_268._0_1_ == false) {
      poVar5 = (ostream *)local_238;
      std::ofstream::ofstream(poVar5);
      local_38 = 0;
      iVar3 = Log::verbosity();
      if (local_38 <= iVar3) {
        poVar5 = Log::get_stream((Log *)local_238);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"TreeFormatter: invalid column width argument \"",0x2e);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,*(char **)(cVar4._M_node + 2),(long)cVar4._M_node[2]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      local_238 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_238 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
      std::filebuf::~filebuf((filebuf *)&local_230);
      std::ios_base::~ios_base(local_140);
      this->m_max_column_width = -1;
    }
  }
  local_238 = (undefined1  [8])local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"print-globals","");
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,(key_type *)local_238);
  if (local_238 != (undefined1  [8])local_228) {
    operator_delete((void *)local_238,local_228[0]._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar4._M_node != p_Var7) {
    this->m_print_globals = true;
  }
  local_238 = (undefined1  [8])0x231957;
  local_230 = "prop:nested";
  lVar6 = 0;
  do {
    local_268 = *(ulong *)(local_238 + lVar6);
    __position = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                           ((this->m_path_key_names).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (this->m_path_key_names).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,&local_268);
    if (__position._M_current !=
        (this->m_path_key_names).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this->m_use_nested = true;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase(&this->m_path_key_names,(iterator)__position._M_current);
    }
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x10);
  pbVar1 = (this->m_path_key_names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->m_path_key_names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 != pbVar2) {
    this->m_use_nested = false;
  }
  local_238 = (undefined1  [8])0x0;
  std::vector<cali::Attribute,_std::allocator<cali::Attribute>_>::_M_fill_assign
            (&this->m_path_keys,(long)pbVar2 - (long)pbVar1 >> 5,(value_type *)local_238);
  return;
}

Assistant:

void configure(const QuerySpec& spec)
    {
        // set path keys (first argument in spec.format.args)

        {
            auto it = spec.format.kwargs.find("path-attributes");
            if (it != spec.format.kwargs.end())
                util::split(it->second, ',', std::back_inserter(m_path_key_names));
        }

        // set max column width
        {
            auto it = spec.format.kwargs.find("column-width");
            if (it != spec.format.kwargs.end()) {
                bool ok = false;

                m_max_column_width = StringConverter(it->second).to_int(&ok);

                if (!ok) {
                    Log(0).stream() << "TreeFormatter: invalid column width argument \"" << it->second << "\""
                                    << std::endl;

                    m_max_column_width = -1;
                }
            }
        }

        {
            auto it = spec.format.kwargs.find("print-globals");
            if (it != spec.format.kwargs.end())
                m_print_globals = true;
        }

        {
            for (const auto path_str : { "path", "prop:nested" }) {
                auto it = std::find(m_path_key_names.begin(), m_path_key_names.end(), path_str);

                if (it != m_path_key_names.end()) {
                    m_use_nested = true;
                    m_path_key_names.erase(it);
                }
            }

            if (!m_path_key_names.empty())
                m_use_nested = false;
        }

        m_path_keys.assign(m_path_key_names.size(), Attribute());
    }